

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Safaia.h
# Opt level: O1

void __thiscall Safaia::Server::loop(Server *this)

{
  int iVar1;
  long lVar2;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  thread local_80;
  vector<std::thread,_std::allocator<std::thread>_> local_78;
  reference_wrapper<Safaia::Resp> local_58;
  reference_wrapper<std::vector<Safaia::Route,_std::allocator<Safaia::Route>_>_> local_50;
  reference_wrapper<bool> local_48;
  reference_wrapper<Safaia::Log> local_40;
  reference_wrapper<int> local_38;
  
  local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < this->thread) {
    iVar1 = 0;
    do {
      local_40._M_data = (Log *)logger;
      local_58._M_data = &this->not_found;
      local_50._M_data = &this->vec_routes;
      local_48._M_data = &this->soft_stop;
      local_38._M_data = &this->sockfd;
      std::thread::
      thread<void(&)(int,Safaia::Log&,bool&,std::vector<Safaia::Route,std::allocator<Safaia::Route>>&,Safaia::Resp&),std::reference_wrapper<int>,std::reference_wrapper<Safaia::Log>,std::reference_wrapper<bool>,std::reference_wrapper<std::vector<Safaia::Route,std::allocator<Safaia::Route>>>,std::reference_wrapper<Safaia::Resp>,void>
                (&local_80,serve,&local_38,&local_40,&local_48,&local_50,&local_58);
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (&local_78,&local_80);
      if (local_80._M_id._M_thread != 0) {
        std::terminate();
      }
      iVar1 = iVar1 + 1;
    } while (iVar1 < this->thread);
  }
  if (0 < this->thread) {
    lVar2 = 0;
    do {
      std::thread::join();
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->thread);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_78);
  return;
}

Assistant:

void loop(){
            std::vector<std::thread> threads;
            for (int i = 0; i < thread; i++){
                threads.push_back(std::thread(serve, std::ref(sockfd), std::ref(logger), std::ref(soft_stop), std::ref(vec_routes), std::ref(not_found)));
            }
            for (int i = 0; i < thread; i++){
                threads[i].join();
            }

        }